

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.cpp
# Opt level: O0

void __thiscall Rml::Event::Event(Event *this)

{
  Event *this_local;
  
  ScriptInterface::ScriptInterface(&this->super_ScriptInterface);
  (this->super_ScriptInterface).super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__Event_00816ae0;
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::flat_map(&this->parameters);
  this->target_element = (Element *)0x0;
  this->current_element = (Element *)0x0;
  ::std::__cxx11::string::string((string *)&this->type);
  this->id = Invalid;
  this->interruptible = false;
  this->interrupted = false;
  this->interrupted_immediate = false;
  this->has_mouse_position = false;
  Vector2<float>::Vector2(&this->mouse_screen_position,0.0,0.0);
  this->phase = None;
  this->instancer = (EventInstancer *)0x0;
  return;
}

Assistant:

Event::Event() {}